

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mov_pc_npc(DisasContext_conflict8 *dc)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGContext_conflict8 *tcg_ctx;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  if (dc->npc == 2) {
    gen_generic_branch(dc);
    tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_pc,(TCGv_i32)tcg_ctx_00->cpu_npc);
    dc->pc = 1;
  }
  else if (dc->npc == 1) {
    tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_pc,(TCGv_i32)tcg_ctx_00->cpu_npc);
    dc->pc = 1;
  }
  else {
    dc->pc = dc->npc;
  }
  return;
}

Assistant:

static inline void gen_mov_pc_npc(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (dc->npc == JUMP_PC) {
        gen_generic_branch(dc);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else if (dc->npc == DYNAMIC_PC) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else {
        dc->pc = dc->npc;
    }
}